

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastEr1P2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  anon_class_40_5_0fd15717 add;
  anon_class_24_3_a3086cf8 size_callback;
  ParseContext *ctx_00;
  MessageLite *pMVar1;
  uint8_t uVar2;
  unsigned_short uVar3;
  uint16_t uVar4;
  uint uVar5;
  char *pcVar6;
  uint *puVar7;
  RepeatedField<int> *pRVar8;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  undefined7 uStack_a7;
  undefined6 uStack_8e;
  uint8_t max;
  RepeatedField<int> *field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_68;
  unsigned_short saved_tag;
  uint64_t local_60;
  TcParseTableBase *local_58;
  ParseContext *local_50;
  char *local_48;
  MessageLite *local_40;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_38 [2];
  uint local_24;
  TcParseTableBase *pTStack_20;
  uint32_t has_bits_offset;
  uint64_t local_18;
  MessageLite *local_10;
  
  local_60 = hasbits;
  local_58 = table;
  local_50 = ctx;
  local_48 = ptr;
  local_40 = msg;
  local_38[0] = data.field_0;
  uVar3 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)local_38);
  pMVar1 = local_40;
  pcVar6 = local_48;
  ctx_00 = local_50;
  if (uVar3 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xffffffffffffff98);
    pcVar6 = MiniParse(pMVar1,pcVar6,ctx_00,(TcFieldData)aStack_68,local_58,local_60);
    return pcVar6;
  }
  local_10 = local_40;
  local_18 = local_60;
  pTStack_20 = local_58;
  local_24 = (uint)local_58->has_bits_offset;
  if (local_24 != 0) {
    uVar5 = (uint)local_60;
    puVar7 = RefAt<unsigned_int>(local_40,(ulong)local_24);
    *puVar7 = uVar5 | *puVar7;
  }
  uVar3 = UnalignedLoad<unsigned_short>(local_48);
  pMVar1 = local_40;
  local_48 = local_48 + 2;
  uVar4 = TcFieldData::offset((TcFieldData *)local_38);
  pRVar8 = RefAt<google::protobuf::RepeatedField<int>>(pMVar1,(ulong)uVar4);
  uVar2 = TcFieldData::aux_idx((TcFieldData *)local_38);
  add._1_7_ = uStack_a7;
  add.max = uVar2;
  add._26_6_ = uStack_8e;
  add.saved_tag = uVar3;
  add.msg = local_40;
  add.table = local_58;
  add.field = pRVar8;
  size_callback.ctx = local_50;
  size_callback.field = pRVar8;
  size_callback.ptr = local_48;
  pcVar6 = EpsCopyInputStream::
           ReadPackedVarint<google::protobuf::internal::TcParser::PackedEnumSmallRange<unsigned_short,(unsigned_char)1>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_,google::protobuf::internal::TcParser::PackedEnumSmallRange<unsigned_short,(unsigned_char)1>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_2_>
                     (&local_50->super_EpsCopyInputStream,local_48,add,size_callback);
  return pcVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEr1P2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return PackedEnumSmallRange<uint16_t, 1>(
      PROTOBUF_TC_PARAM_PASS);
}